

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++:1188:13)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1188:13)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<kj::_::Void> *pEVar1;
  Maybe<int> *in;
  Void local_531;
  ExceptionOr<kj::_::Void> local_530;
  Maybe<int> *local_390;
  Maybe<int> *depValue;
  Maybe<int> *_depValue779;
  Exception *local_1e0;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_1c0 [8];
  ExceptionOr<kj::Maybe<int>_> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<kj::Maybe<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1188:13)>
  *this_local;
  
  depResult._416_8_ = output;
  ExceptionOr<kj::Maybe<int>_>::ExceptionOr((ExceptionOr<kj::Maybe<int>_> *)local_1c0);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1c0);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1c0);
  if (depException == (Exception *)0x0) {
    depValue = readMaybe<kj::Maybe<int>>
                         ((Maybe<kj::Maybe<int>_> *)
                          ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.
                                  details.builder + 0x18));
    if (depValue != (Maybe<int> *)0x0) {
      local_390 = depValue;
      in = mv<kj::Maybe<int>>(depValue);
      MaybeVoidCaller<kj::Maybe<int>,kj::_::Void>::
      apply<capnp::_::TestMoreStuffImpl::writeToFd(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::WriteToFdParams,capnproto_test::capnp::test::TestMoreStuff::WriteToFdResults>)::__0>
                ((Type *)&this->field_0x20,in);
      TransformPromiseNodeBase::handle<kj::_::Void>
                (&local_530,&this->super_TransformPromiseNodeBase,&local_531);
      pEVar1 = ExceptionOrValue::as<kj::_::Void>((ExceptionOrValue *)depResult._416_8_);
      ExceptionOr<kj::_::Void>::operator=(pEVar1,&local_530);
      ExceptionOr<kj::_::Void>::~ExceptionOr(&local_530);
    }
  }
  else {
    local_1e0 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<kj::_::Void>::ExceptionOr((ExceptionOr<kj::_::Void> *)&_depValue779,false,exception)
    ;
    pEVar1 = ExceptionOrValue::as<kj::_::Void>((ExceptionOrValue *)depResult._416_8_);
    ExceptionOr<kj::_::Void>::operator=(pEVar1,(ExceptionOr<kj::_::Void> *)&_depValue779);
    ExceptionOr<kj::_::Void>::~ExceptionOr((ExceptionOr<kj::_::Void> *)&_depValue779);
  }
  ExceptionOr<kj::Maybe<int>_>::~ExceptionOr((ExceptionOr<kj::Maybe<int>_> *)local_1c0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }